

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  bool bVar1;
  size_type sVar2;
  reference ppcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string *errors_str;
  DefinedTestIter it_1;
  DefinedTestIter it;
  bool found;
  string name;
  char *names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  Message errors;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  key_type *in_stack_fffffffffffffe38;
  string *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe40;
  FILE *__stream;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe50;
  allocator<char> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *in_stack_fffffffffffffe78;
  string local_138 [28];
  int in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  undefined1 local_e9 [33];
  _Self local_c8;
  _Self local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  _Self local_a8;
  _Self local_a0;
  byte local_91;
  undefined4 local_90;
  string local_80 [32];
  char *local_60;
  char *local_20;
  
  *in_RDI = 1;
  local_20 = SkipSpaces((char *)0x124b46);
  Message::Message((Message *)in_stack_fffffffffffffe60);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x124b68);
  local_60 = local_20;
  do {
    if (local_60 == (char *)0x0) {
      local_c0._M_node =
           (_Base_ptr)
           std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::begin
                     ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *)
                      in_stack_fffffffffffffe28);
      while( true ) {
        local_c8._M_node =
             (_Base_ptr)
             std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::end
                       ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *
                        )in_stack_fffffffffffffe28);
        bVar1 = std::operator!=(&local_c0,&local_c8);
        if (!bVar1) break;
        ppcVar3 = std::_Rb_tree_const_iterator<const_char_*>::operator*
                            ((_Rb_tree_const_iterator<const_char_*> *)in_stack_fffffffffffffe30);
        pcVar7 = *ppcVar3;
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this_01,pcVar7,in_stack_fffffffffffffe60)
        ;
        in_stack_fffffffffffffe60 =
             (allocator<char> *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::count(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        std::__cxx11::string::~string((string *)(local_e9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_e9);
        if (in_stack_fffffffffffffe60 == (allocator<char> *)0x0) {
          Message::operator<<((Message *)in_stack_fffffffffffffe30,
                              (char (*) [25])in_stack_fffffffffffffe28);
          std::_Rb_tree_const_iterator<const_char_*>::operator*
                    ((_Rb_tree_const_iterator<const_char_*> *)in_stack_fffffffffffffe30);
          Message::operator<<((Message *)in_stack_fffffffffffffe30,
                              (char **)in_stack_fffffffffffffe28);
          Message::operator<<((Message *)in_stack_fffffffffffffe30,
                              (char (*) [3])in_stack_fffffffffffffe28);
        }
        std::_Rb_tree_const_iterator<const_char_*>::operator++
                  ((_Rb_tree_const_iterator<const_char_*> *)in_stack_fffffffffffffe30);
      }
      Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffe38);
      bVar1 = std::operator!=(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      if (bVar1) {
        __stream = _stderr;
        FormatFileLocation_abi_cxx11_(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
        this_00 = local_138;
        uVar4 = std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::c_str();
        fprintf(__stream,"%s %s",uVar4,uVar5);
        std::__cxx11::string::~string(this_00);
        fflush(_stderr);
        posix::Abort();
      }
      local_90 = 1;
      pcVar7 = local_20;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x12509f);
      Message::~Message((Message *)0x1250ac);
      return pcVar7;
    }
    GetPrefixUntilComma_abi_cxx11_(in_stack_fffffffffffffe78);
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    if (sVar2 == 0) {
      local_91 = 0;
      local_a0._M_node =
           (_Base_ptr)
           std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::begin
                     ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *)
                      in_stack_fffffffffffffe28);
      while( true ) {
        local_a8._M_node =
             (_Base_ptr)
             std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::end
                       ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *
                        )in_stack_fffffffffffffe28);
        bVar1 = std::operator!=(&local_a0,&local_a8);
        if (!bVar1) break;
        std::_Rb_tree_const_iterator<const_char_*>::operator*
                  ((_Rb_tree_const_iterator<const_char_*> *)in_stack_fffffffffffffe30);
        bVar1 = std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
        if (bVar1) {
          local_91 = 1;
          break;
        }
        std::_Rb_tree_const_iterator<const_char_*>::operator++
                  ((_Rb_tree_const_iterator<const_char_*> *)in_stack_fffffffffffffe30);
      }
      if ((local_91 & 1) == 0) {
        Message::operator<<((Message *)in_stack_fffffffffffffe30,
                            (char (*) [15])in_stack_fffffffffffffe28);
        Message::operator<<((Message *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        Message::operator<<((Message *)in_stack_fffffffffffffe30,
                            (char (*) [34])in_stack_fffffffffffffe28);
      }
      else {
        pVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(in_stack_fffffffffffffe50,
                         (value_type *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48)
                        );
        local_b8 = (_Base_ptr)pVar6.first._M_node;
        local_b0 = pVar6.second;
      }
      local_90 = 0;
    }
    else {
      Message::operator<<((Message *)in_stack_fffffffffffffe30,
                          (char (*) [6])in_stack_fffffffffffffe28);
      Message::operator<<((Message *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      Message::operator<<((Message *)in_stack_fffffffffffffe30,
                          (char (*) [28])in_stack_fffffffffffffe28);
      local_90 = 4;
    }
    std::__cxx11::string::~string(local_80);
    in_stack_fffffffffffffe78 = SkipComma((char *)in_stack_fffffffffffffe28);
    local_60 = in_stack_fffffffffffffe78;
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<std::string> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const std::string name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}